

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

Info * __thiscall EOPlus::Parser::ParseMain(Info *__return_storage_ptr__,Parser *this)

{
  variant *this_00;
  int iVar1;
  int iVar2;
  Parser_Token_Server_Base *pPVar3;
  bool bVar4;
  uint uVar5;
  undefined8 uVar6;
  Parser_Error *pPVar7;
  Token *t_00;
  allocator<char> local_1a1;
  uint local_1a0;
  uint local_19c;
  string local_198;
  uint *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Token t;
  undefined1 local_c0 [64];
  Token local_80;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->disabled = false;
  __return_storage_ptr__->version = 0;
  __return_storage_ptr__->hidden = NotHidden;
  util::variant::variant((variant *)local_c0);
  Token::Token(&t,Invalid,(variant *)local_c0);
  local_178 = &__return_storage_ptr__->version;
  std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  this_00 = &t.data;
  local_19c = 0;
  local_1a0 = 0;
  do {
    while( true ) {
      bVar4 = GetToken(this,&t,0x41);
      if (!bVar4) goto LAB_0013177f;
      if (t.type != Identifier) break;
      util::variant::GetString_abi_cxx11_(&local_198,this_00);
      bVar4 = std::operator==(&local_198,"questname");
      std::__cxx11::string::~string((string *)&local_198);
      if (bVar4) {
        if ((local_19c & 1) != 0) {
          pPVar7 = (Parser_Error *)__cxa_allocate_exception(0x18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,"Main-block can only contain one questname.",
                     (allocator<char> *)&local_170);
          pPVar3 = (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
          iVar1 = pPVar3->line;
          iVar2 = pPVar3->reject_line;
          if (iVar2 < iVar1) {
            iVar2 = iVar1;
          }
          Parser_Error::Parser_Error(pPVar7,&local_198,iVar2);
          __cxa_throw(pPVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
        }
        ParseQuestName_abi_cxx11_(&local_198,this);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_198);
        uVar6 = std::__cxx11::string::~string((string *)&local_198);
        local_19c = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
      }
      else {
        util::variant::GetString_abi_cxx11_(&local_198,this_00);
        bVar4 = std::operator==(&local_198,"version");
        std::__cxx11::string::~string((string *)&local_198);
        if (bVar4) {
          if ((local_1a0 & 1) != 0) {
            pPVar7 = (Parser_Error *)__cxa_allocate_exception(0x18);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_198,"Main-block can only contain one version.",
                       (allocator<char> *)&local_170);
            pPVar3 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            iVar1 = pPVar3->line;
            iVar2 = pPVar3->reject_line;
            if (iVar2 < iVar1) {
              iVar2 = iVar1;
            }
            Parser_Error::Parser_Error(pPVar7,&local_198,iVar2);
            __cxa_throw(pPVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar5 = ParseVersion(this);
          *local_178 = uVar5;
          local_1a0 = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
        }
        else {
          util::variant::GetString_abi_cxx11_(&local_198,this_00);
          bVar4 = std::operator==(&local_198,"hidden");
          std::__cxx11::string::~string((string *)&local_198);
          if (bVar4) {
            if (__return_storage_ptr__->hidden != NotHidden) {
              pPVar7 = (Parser_Error *)__cxa_allocate_exception(0x18);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_198,"Main-block can only contain one hidden attribute.",
                         (allocator<char> *)&local_170);
              pPVar3 = (this->tok)._M_t.
                       super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                       _M_head_impl;
              iVar1 = pPVar3->line;
              iVar2 = pPVar3->reject_line;
              if (iVar2 < iVar1) {
                iVar2 = iVar1;
              }
              Parser_Error::Parser_Error(pPVar7,&local_198,iVar2);
              __cxa_throw(pPVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
            }
            __return_storage_ptr__->hidden = Hidden;
          }
          else {
            util::variant::GetString_abi_cxx11_(&local_198,this_00);
            bVar4 = std::operator==(&local_198,"hidden_end");
            std::__cxx11::string::~string((string *)&local_198);
            if (bVar4) {
              if (__return_storage_ptr__->hidden != NotHidden) {
                pPVar7 = (Parser_Error *)__cxa_allocate_exception(0x18);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_198,"Main-block can only contain one hidden attribute.",
                           (allocator<char> *)&local_170);
                pPVar3 = (this->tok)._M_t.
                         super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                         _M_head_impl;
                iVar1 = pPVar3->line;
                iVar2 = pPVar3->reject_line;
                if (iVar2 < iVar1) {
                  iVar2 = iVar1;
                }
                Parser_Error::Parser_Error(pPVar7,&local_198,iVar2);
                __cxa_throw(pPVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
              }
              __return_storage_ptr__->hidden = HiddenEnd;
            }
            else {
              util::variant::GetString_abi_cxx11_(&local_198,this_00);
              bVar4 = std::operator==(&local_198,"disabled");
              std::__cxx11::string::~string((string *)&local_198);
              if (!bVar4) goto LAB_0013177f;
              if (__return_storage_ptr__->disabled == true) {
                pPVar7 = (Parser_Error *)__cxa_allocate_exception(0x18);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_198,
                           "Main-block can only contain one disabled attribute.",
                           (allocator<char> *)&local_170);
                pPVar3 = (this->tok)._M_t.
                         super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                         _M_head_impl;
                iVar1 = pPVar3->line;
                iVar2 = pPVar3->reject_line;
                if (iVar2 < iVar1) {
                  iVar2 = iVar1;
                }
                Parser_Error::Parser_Error(pPVar7,&local_198,iVar2);
                __cxa_throw(pPVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
              }
              __return_storage_ptr__->disabled = true;
            }
          }
        }
      }
    }
  } while (t.type != Symbol);
  util::variant::GetString_abi_cxx11_(&local_198,this_00);
  bVar4 = std::operator==(&local_198,"}");
  std::__cxx11::string::~string((string *)&local_198);
  if (bVar4) {
    std::__cxx11::string::~string((string *)&t.data.val_string);
    return __return_storage_ptr__;
  }
LAB_0013177f:
  pPVar7 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,
             "Expected main-block entry (questname/version/hidden/hidden_end/disabled) or closing brace \'}\'."
             ,&local_1a1);
  std::operator+(&local_170,&local_130," Got: ");
  Token::Token(&local_80,
               &((this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)->
                reject_token);
  token_got_string_abi_cxx11_(&local_150,(EOPlus *)&local_80,t_00);
  std::operator+(&local_198,&local_170,&local_150);
  pPVar3 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar1 = pPVar3->line;
  iVar2 = pPVar3->reject_line;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  Parser_Error::Parser_Error(pPVar7,&local_198,iVar2);
  __cxa_throw(pPVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Info Parser::ParseMain()
	{
		bool has_questname = false;
		bool has_version = false;
		Info info;
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::Symbol))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "questname")
				{
					if (has_questname)
						PARSER_ERROR("Main-block can only contain one questname.");

					has_questname = true;
					info.name = ParseQuestName();
				}
				else if (std::string(t.data) == "version")
				{
					if (has_version)
						PARSER_ERROR("Main-block can only contain one version.");

					has_version = true;
					info.version = ParseVersion();
				}
				else if (std::string(t.data) == "hidden")
				{
					if (info.hidden != Info::NotHidden)
						PARSER_ERROR("Main-block can only contain one hidden attribute.");

					info.hidden = Info::Hidden;
				}
				else if (std::string(t.data) == "hidden_end")
				{
					if (info.hidden != Info::NotHidden)
						PARSER_ERROR("Main-block can only contain one hidden attribute.");

					info.hidden = Info::HiddenEnd;
				}
				else if (std::string(t.data) == "disabled")
				{
					if (info.disabled)
						PARSER_ERROR("Main-block can only contain one disabled attribute.");

					info.disabled = true;
				}
				else
				{
					break;
				}
			}
			else if (t.type == Token::Symbol)
			{
				if (std::string(t.data) == "}")
					return info;
				else
					break;
			}
		}

		PARSER_ERROR_GOT("Expected main-block entry (questname/version/hidden/hidden_end/disabled) or closing brace '}'.");
	}